

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O3

void __thiscall
btMultiBodyConstraint::btMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBody *bodyA,btMultiBody *bodyB,int linkA,int linkB,
          int numRows,bool isUnilateral)

{
  this->_vptr_btMultiBodyConstraint = (_func_int **)&PTR__btMultiBodyConstraint_00221140;
  this->m_bodyA = bodyA;
  this->m_bodyB = bodyB;
  this->m_linkA = linkA;
  this->m_linkB = linkB;
  this->m_numRows = numRows;
  this->m_jacSizeA = 0;
  this->m_jacSizeBoth = 0;
  this->m_isUnilateral = isUnilateral;
  this->m_numDofsFinalized = -1;
  this->m_maxAppliedImpulse = 100.0;
  (this->m_data).m_ownsMemory = true;
  (this->m_data).m_data = (float *)0x0;
  (this->m_data).m_size = 0;
  (this->m_data).m_capacity = 0;
  return;
}

Assistant:

btMultiBodyConstraint::btMultiBodyConstraint(btMultiBody* bodyA,btMultiBody* bodyB,int linkA, int linkB, int numRows, bool isUnilateral)
	:m_bodyA(bodyA),
	m_bodyB(bodyB),
	m_linkA(linkA),
	m_linkB(linkB),
	m_numRows(numRows),
	m_jacSizeA(0),
	m_jacSizeBoth(0),
	m_isUnilateral(isUnilateral),
	m_numDofsFinalized(-1),
	m_maxAppliedImpulse(100)
{

}